

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.hpp
# Opt level: O2

rb_tree_node<int> * __thiscall
nestl::test::allocator_with_state<nestl::impl::detail::rb_tree_node<int>_>::
allocate<nestl::has_exceptions::exception_ptr_error>
          (allocator_with_state<nestl::impl::detail::rb_tree_node<int>_> *this,
          exception_ptr_error *err,size_t n,void *param_3)

{
  rb_tree_node<int> *prVar1;
  rb_tree<void_*,_void_*,_nestl::impl::detail::identity<void_*>,_std::less<void_*>,_nestl::allocator<void_*>_>
  *this_00;
  iterator iVar2;
  element_type *peVar3;
  rb_tree<void*,void*,nestl::impl::detail::identity<void*>,std::less<void*>,nestl::allocator<void*>>
  *this_01;
  default_operation_error _;
  exception_ptr local_28;
  rb_tree_node<int> *local_20;
  
  prVar1 = (rb_tree_node<int> *)operator_new(n * 0x28,(nothrow_t *)&std::nothrow);
  if (prVar1 == (rb_tree_node<int> *)0x0) {
    has_exceptions::build_bad_alloc(err);
  }
  else {
    this_00 = &impl::
               shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>::
               operator->(&this->m_allocated_storage)->m_impl;
    local_28._M_exception_object = prVar1;
    iVar2 = impl::detail::
            rb_tree<void_*,_void_*,_nestl::impl::detail::identity<void_*>,_std::less<void_*>,_nestl::allocator<void_*>_>
            ::find(this_00,&local_28._M_exception_object);
    peVar3 = impl::
             shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>::
             operator->(&this->m_allocated_storage);
    if (iVar2.m_node != &(peVar3->m_impl).m_impl.m_header) {
      local_28._M_exception_object = prVar1;
      fatal_failure<char_const(&)[10],void*,char_const(&)[35]>
                ((char (*) [10])"pointer [",&local_28._M_exception_object,
                 (char (*) [35])"] already belong to this allocator");
    }
    local_28._M_exception_object = (void *)0x0;
    this_01 = (rb_tree<void*,void*,nestl::impl::detail::identity<void*>,std::less<void*>,nestl::allocator<void*>>
               *)impl::
                 shared_ptr<nestl::impl::set<void_*,_std::less<void_*>,_nestl::allocator<void_*>_>_>
                 ::operator->(&this->m_allocated_storage);
    local_20 = prVar1;
    impl::detail::
    rb_tree<void*,void*,nestl::impl::detail::identity<void*>,std::less<void*>,nestl::allocator<void*>>
    ::m_insert_unique<nestl::has_exceptions::exception_ptr_error,void*>
              (this_01,(exception_ptr_error *)&local_28,&local_20);
    check_error((default_operation_error *)&local_28,"m_allocated_storage->insert_nothrow(_, res)");
    std::__exception_ptr::exception_ptr::~exception_ptr(&local_28);
  }
  return prVar1;
}

Assistant:

T* allocate(OperationError& err, std::size_t n, const void* /* hint */ = 0) NESTL_NOEXCEPT_SPEC
    {
        auto res = static_cast<T*>(::operator new(n * sizeof(value_type), std::nothrow));
        if (!res)
        {
            build_bad_alloc(err);
            return nullptr;
        }

        nestl::set<void*>::const_iterator pos = m_allocated_storage->find(res);
        if (pos != m_allocated_storage->end())
        {
            fatal_failure("pointer [", static_cast<void*>(res), "] already belong to this allocator");
        }

        NESTL_CHECK_OPERATION(m_allocated_storage->insert_nothrow(_, res));

        return res;
    }